

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_present.c
# Opt level: O2

_Bool is_present(char letter,char *word)

{
  char cVar1;
  
  do {
    cVar1 = *word;
    if (cVar1 == letter) break;
    word = word + 1;
  } while (cVar1 != '\0');
  return cVar1 != '\0';
}

Assistant:

bool is_present(char letter, char* word) {
  size_t n = 0;
  while (word[n]) {
    if (word[n] == letter) return true;
    n++;
  }
  return false;
}